

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O2

bool llvm::ConvertUTF8toWide(char *Source,wstring *Result)

{
  bool bVar1;
  size_t sVar2;
  StringRef Source_00;
  
  if (Source != (char *)0x0) {
    sVar2 = strlen(Source);
    Source_00.Length = sVar2;
    Source_00.Data = Source;
    bVar1 = ConvertUTF8toWide(Source_00,Result);
    return bVar1;
  }
  Result->_M_string_length = 0;
  *(Result->_M_dataplus)._M_p = L'\0';
  return true;
}

Assistant:

bool ConvertUTF8toWide(const char *Source, std::wstring &Result) {
  if (!Source) {
    Result.clear();
    return true;
  }
  return ConvertUTF8toWide(llvm::StringRef(Source), Result);
}